

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O1

void __thiscall puppup::Game::checkWinner(Game *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = this->turn_;
  lVar1 = (this->state_).score;
  lVar3 = 0;
  do {
    lVar1 = lVar1 + *(long *)((long)(this->racks_)._M_elems[uVar2 ^ 1]._M_elems + lVar3) *
                    *(long *)((long)&scores + lVar3);
    (this->state_).score = lVar1;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0xd8);
  lVar1 = (this->state_).score;
  if (lVar1 < 1) {
    uVar2 = 2;
    if (lVar1 < 0) {
      uVar2 = this->turn_ ^ 1;
    }
  }
  else {
    uVar2 = this->turn_;
  }
  this->winner_ = uVar2;
  return;
}

Assistant:

void checkWinner() {
        for (chr i = 0; i < 27; ++i) {
            state_.score += scores[i] * racks_[turn_ ^ 1][i];
        }
        // print(racks_[turn_]);
        // print(racks_[turn_ ^ 1]);
        // std::cerr << state_.score << std::endl;
        if (state_.score > 0) {
            winner_ = turn_;
        } else if (state_.score < 0) {
            winner_ = turn_ ^ 1;
        } else {
            winner_ = 2;
        }
    }